

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_oram.h
# Opt level: O3

void __thiscall CircuitOram::flush(CircuitOram *this,int path)

{
  uint uVar1;
  Bucket<int> *pBVar2;
  int *piVar3;
  pointer ppBVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  int pos;
  ulong uVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> deepest;
  vector<int,_std::allocator<int>_> deepest_depth;
  vector<int,_std::allocator<int>_> target;
  vector<int,_std::allocator<int>_> deepest_index;
  allocator_type local_95;
  value_type_conflict local_94;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)(this->super_TreeOram).logN + 1,(value_type_conflict *)&local_78,
             (allocator_type *)&local_90);
  local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_78,(long)(this->super_TreeOram).logN + 1,(value_type_conflict *)&local_90,
             (allocator_type *)&local_60);
  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_90,(long)(this->super_TreeOram).logN + 1,(value_type_conflict *)&local_60,
             (allocator_type *)&local_94);
  local_94 = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)(this->super_TreeOram).logN + 1,&local_94,&local_95);
  uVar11 = (this->super_TreeOram).h;
  if (-1 < (int)uVar11) {
    lVar13 = 0;
    do {
      pBVar2 = (this->super_TreeOram).tree.
               super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(1L << ((char)uVar11 - 1U & 0x3f)) + path >>
                ((char)uVar11 - (char)lVar13 & 0x1fU)];
      piVar10 = *(int **)&pBVar2->blocks;
      piVar3 = *(pointer *)((long)&pBVar2->blocks + 8);
      if (piVar10 != piVar3) {
        do {
          iVar7 = *piVar10;
          if ((long)iVar7 != -1) {
            iVar6 = TreeOram::push_distance
                              (&this->super_TreeOram,path,
                               (this->super_TreeOram).index.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar7]);
            if (*(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar13 * 4) < iVar6) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] = iVar7;
              *(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar13 * 4) = iVar6;
            }
          }
          piVar10 = piVar10 + 1;
        } while (piVar10 != piVar3);
        uVar11 = (this->super_TreeOram).h;
      }
      bVar5 = lVar13 < (int)uVar11;
      lVar13 = lVar13 + 1;
    } while (bVar5);
  }
  if (*local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start == -1) {
    iVar7 = -1;
    uVar9 = 0xffffffff;
  }
  else {
    iVar7 = *(int *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
    uVar9 = 0;
  }
  if (0 < (int)uVar11) {
    uVar12 = 1;
    do {
      if ((long)uVar12 <= (long)iVar7) {
        *(int *)(CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) = (int)uVar9;
        uVar11 = (this->super_TreeOram).h;
      }
      iVar6 = *(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + uVar12 * 4);
      if (iVar7 < iVar6) {
        uVar9 = uVar12 & 0xffffffff;
        iVar7 = iVar6;
      }
      bVar5 = (long)uVar12 < (long)(int)uVar11;
      uVar12 = uVar12 + 1;
    } while (bVar5);
  }
  if (-1 < (int)uVar11) {
    ppBVar4 = (this->super_TreeOram).tree.
              super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar6 = -uVar11;
    iVar7 = -1;
    uVar12 = 0xffffffff;
    uVar9 = (ulong)uVar11;
    do {
      if (uVar9 == uVar12) {
        *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + uVar9 * 4) = iVar7;
        uVar11 = (this->super_TreeOram).h;
        uVar12 = 0xffffffff;
        iVar7 = -1;
      }
      if (((iVar7 == -1) &&
          (pBVar2 = ppBVar4[(int)(1L << ((char)uVar11 - 1U & 0x3f)) + path >>
                            ((char)uVar11 + (char)iVar6 & 0x1fU)],
          pBVar2->bsize <
          (int)((ulong)((long)*(pointer *)((long)&pBVar2->blocks + 8) - *(long *)&pBVar2->blocks) >>
               2))) ||
         (*(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + uVar9 * 4) != -1)) {
        uVar8 = *(uint *)(CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) + uVar9 * 4);
        if (uVar8 != 0xffffffff) {
          uVar12 = (ulong)uVar8;
        }
        if (uVar8 != 0xffffffff) {
          iVar7 = (int)uVar9;
        }
      }
      iVar6 = iVar6 + 1;
      bVar5 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar5);
    if (-1 < (int)uVar11) {
      iVar7 = -1;
      uVar12 = 0xffffffff;
      uVar9 = 0;
      uVar8 = uVar11;
      do {
        if (iVar7 == -1) {
          iVar7 = -1;
LAB_00104f68:
          pos = -1;
          iVar6 = iVar7;
        }
        else {
          if (uVar9 != uVar12) goto LAB_00104f68;
          uVar12 = 0xffffffff;
          iVar6 = -1;
          pos = iVar7;
        }
        iVar7 = iVar6;
        uVar1 = *(uint *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) + uVar9 * 4);
        if (uVar1 != 0xffffffff) {
          iVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
          pBVar2 = (this->super_TreeOram).tree.
                   super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(int)(1L << ((char)uVar8 - 1U & 0x3f)) + path >>
                    ((char)uVar8 - (char)uVar9 & 0x1fU)];
          if (pBVar2->bsize != 0) {
            for (piVar10 = *(int **)&pBVar2->blocks;
                piVar10 != *(pointer *)((long)&pBVar2->blocks + 8); piVar10 = piVar10 + 1) {
              if (*piVar10 == iVar7) {
                *piVar10 = -1;
                pBVar2->bsize = pBVar2->bsize + -1;
                uVar12 = (ulong)*(uint *)(CONCAT44(local_60.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_60.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         uVar9 * 4);
                uVar11 = (this->super_TreeOram).h;
                uVar8 = uVar11;
                goto LAB_00104fe2;
              }
            }
          }
          uVar12 = (ulong)uVar1;
          uVar8 = uVar11;
        }
LAB_00104fe2:
        if (pos != -1) {
          Bucket<int>::add((this->super_TreeOram).tree.
                           super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(int)(1L << ((char)uVar8 - 1U & 0x3f)) + path >>
                            ((char)uVar8 - (char)uVar9 & 0x1fU)],pos);
          uVar11 = (this->super_TreeOram).h;
          uVar8 = uVar11;
        }
        bVar5 = (long)uVar9 < (long)(int)uVar8;
        uVar9 = uVar9 + 1;
      } while (bVar5);
    }
  }
  if ((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void flush(int path)
      {
         vector<int> deepest_index(logN+1, -1);
         vector<int> deepest_depth(logN+1, -1);
         vector<int> deepest(logN+1, -1);
         vector<int> target(logN+1, -1);
         int src = -1, goal = -1;
         for(int i = 0; i <= h; ++i) {
            for(auto v : tree[bucketAt(path, i)]->blocks) {
               if(v!=-1) {
                  int d = push_distance(path, index[v]);
                  if(d > deepest_depth[i]) {
                     deepest_index[i] = v;
                     deepest_depth[i] = d;
                  }
               }
            }
         }

         if(deepest_index[0] != -1) {
            src = 0;
            goal = deepest_depth[0];
         }

         for(int  i = 1; i <=h; ++i) {
            if(goal >= i)
               deepest[i] = src;
            int l = deepest_depth[i];
            if(l > goal) {
               goal = l;
               src = i;
            }
         }

         int dest = -1; src = -1;
         for(int  i = h; i >= 0; --i) {
            if(i == src) {
               target[i] = dest;
               dest = -1;
               src = -1;
            }
            bool has_empty = tree[bucketAt(path, i)]->size() < tree[bucketAt(path, i)]->capacity();
            if( ( (dest == -1 and has_empty) or target[i]!=-1 ) and deepest[i]!=-1) {
               src = deepest[i];
               dest = i;
            }
         }
         dest = -1;
         int hold = -1;
         int to_write = -1;
         for(int i = 0; i <= h; ++i) {
            to_write = -1;
            if(hold != -1 and i == dest) {
               to_write = hold;
               hold = -1;
               dest = -1;
            }
            if(target[i]!=-1) {
               hold = deepest_index[i];
               tree[bucketAt(path, i)]->readAndRemove(deepest_index[i]);
               dest = target[i];
            }
            if(to_write != -1)
               tree[bucketAt(path, i)]->add(to_write);
         }
      }